

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O1

string_view __thiscall libtorrent::aux::strip_string(aux *this,string_view in)

{
  byte *pbVar1;
  undefined1 auVar2 [16];
  byte *pbVar3;
  string_view sVar4;
  
  pbVar3 = (byte *)in._M_len;
  if (this != (aux *)0x0) {
    pbVar1 = pbVar3 + (long)this;
    do {
      if ((4 < *pbVar3 - 9) && (*pbVar3 != 0x20)) goto LAB_0031306e;
      pbVar3 = pbVar3 + 1;
      this = this + -1;
    } while (this != (aux *)0x0);
    this = (aux *)0x0;
    pbVar3 = pbVar1;
  }
LAB_0031306e:
  if (this != (aux *)0x0) {
    while (((pbVar3 + -1)[(long)this] - 9 < 5 || ((pbVar3 + -1)[(long)this] == 0x20))) {
      this = this + -1;
      if (this == (aux *)0x0) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = pbVar3;
        return (string_view)(auVar2 << 0x40);
      }
    }
  }
  sVar4._M_str = (char *)pbVar3;
  sVar4._M_len = (size_t)this;
  return sVar4;
}

Assistant:

string_view strip_string(string_view in)
	{
		while (!in.empty() && is_space(in.front()))
			in.remove_prefix(1);

		while (!in.empty() && is_space(in.back()))
			in.remove_suffix(1);
		return in;
	}